

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_exception.cc
# Opt level: O0

void __thiscall
rcdiscover::SocketException::SocketException(SocketException *this,string *msg,int errnum)

{
  undefined4 in_EDX;
  string *in_RSI;
  runtime_error *in_RDI;
  string local_68 [24];
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffdc;
  
  std::runtime_error::runtime_error(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__SocketException_0015dca0;
  *(undefined4 *)(in_RDI + 0x10) = in_EDX;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::to_string(in_stack_ffffffffffffffdc);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

SocketException::SocketException(const std::string& msg, const int errnum) :
  std::runtime_error(msg),
  errnum_(errnum),
  msg_(msg + " - " + std::to_string(errnum))
{ }